

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmGetNextLine(SyString *pCursor,SyString *pCurrent)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  uVar4 = pCursor->nByte;
  if (uVar4 != 0) {
    pcVar7 = pCursor->zString;
    pcVar5 = pcVar7;
    do {
      pcVar5 = pcVar5 + 1;
      cVar1 = *pcVar7;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      {
        pcVar3 = pcVar7 + uVar4;
        goto LAB_0012255f;
      }
      pcVar7 = pcVar7 + 1;
      uVar4 = uVar4 - 1;
      pCursor->nByte = uVar4;
      pCursor->zString = pcVar7;
    } while (uVar4 != 0);
  }
  pCurrent->zString = (char *)0x0;
  pCurrent->nByte = 0;
  return -0x12;
  while( true ) {
    pcVar6 = pcVar5;
    if ((*pcVar5 == '\n') || (*pcVar5 == '\r')) goto LAB_001225d6;
    pcVar6 = pcVar5 + 1;
    if (pcVar3 <= pcVar6) break;
    if ((*pcVar6 == '\n') || (*pcVar6 == '\r')) goto LAB_001225d6;
    pcVar6 = pcVar5 + 2;
    if (pcVar3 <= pcVar6) break;
    if ((*pcVar6 == '\n') || (*pcVar6 == '\r')) goto LAB_001225d6;
    pcVar6 = pcVar5 + 3;
    pcVar5 = pcVar5 + 4;
    if (pcVar3 <= pcVar6) break;
LAB_0012255f:
    if ((pcVar5[-1] == '\n') || (pcVar5[-1] == '\r')) {
      pcVar6 = pcVar5 + -1;
LAB_001225d6:
      pCurrent->zString = pcVar7;
      uVar4 = (uint)((long)pcVar6 - (long)pcVar7);
      pCurrent->nByte = uVar4;
      pCursor->zString = pcVar7 + ((long)pcVar6 - (long)pcVar7 & 0xffffffff);
      pCursor->nByte = pCursor->nByte - uVar4;
      return 0;
    }
    if (pcVar3 <= pcVar5) break;
  }
  pCurrent->zString = pcVar7;
  pCurrent->nByte = uVar4;
  return -8;
}

Assistant:

static sxi32 VmGetNextLine(SyString *pCursor, SyString *pCurrent)
{ 
  	const char *zIn;
  	sxu32 nPos; 
	/* Jump leading white spaces */
	SyStringLeftTrim(pCursor);
	if( pCursor->nByte < 1 ){
		SyStringInitFromBuf(pCurrent, 0, 0);
		return SXERR_EOF; /* End of input */
	}
	zIn = SyStringData(pCursor);
	if( SXRET_OK != SyByteListFind(pCursor->zString, pCursor->nByte, "\r\n", &nPos) ){
		/* Line not found, tell the caller to read more input from source */
		SyStringDupPtr(pCurrent, pCursor);
		return SXERR_MORE;
	}
  	pCurrent->zString = zIn;
  	pCurrent->nByte	= nPos;	
  	/* advance the cursor so we can call this routine again */
  	pCursor->zString = &zIn[nPos];
  	pCursor->nByte -= nPos;
  	return SXRET_OK;
 }